

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NavierStokesBase.cpp
# Opt level: O1

void __thiscall NavierStokesBase::velocity_advection(NavierStokesBase *this,Real dt)

{
  BoxArray *bxs;
  DistributionMapping *dm;
  pointer pSVar1;
  int iVar2;
  TimeCenter TVar3;
  int iVar4;
  MultiFab *dst;
  FabArray<amrex::FArrayBox> *this_00;
  MultiFab *src;
  long lVar5;
  int *piVar6;
  int *piVar7;
  int *piVar8;
  long lVar9;
  long lVar10;
  long lVar11;
  long lVar12;
  long lVar13;
  long lVar14;
  long lVar15;
  long lVar16;
  bool bVar17;
  Real time;
  double dVar18;
  Box force_bx;
  Box state_bx;
  MFIter U_mfi_1;
  MFIter U_mfi;
  MultiFab visc_terms;
  FillPatchIterator U_fpi;
  MultiFab forcing_term;
  FillPatchIterator Rho_fpi;
  long local_b20;
  long local_b18;
  long local_b10;
  long local_af8;
  long local_af0;
  Array4<double> local_a80;
  Box local_a3c;
  __uniq_ptr_impl<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_> local_a20;
  long local_a18;
  long local_a10;
  long local_a08;
  long local_a00;
  Array4<const_double> local_9f8;
  MFIter local_9b8;
  Array4<const_double> local_958;
  MFInfo local_918;
  undefined1 local_8e8 [16];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_8d8;
  int local_8c0;
  FabArray<amrex::FArrayBox> local_758;
  undefined1 local_5d8 [16];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_5c8 [5];
  FabArray<amrex::FArrayBox> local_550;
  FabArray<amrex::FArrayBox> local_3c0;
  FillPatchIterator local_240;
  
  if (verbose != 0) {
    if (do_mom_diff == 0) {
      local_5d8._8_8_ = amrex::OutStream();
      local_5d8._4_4_ = *(MPI_Comm *)(DAT_00756620 + -0x48);
      local_5d8._0_4_ = *(int *)(DAT_00756620 + -0x30);
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_5c8);
      *(undefined8 *)
       ((long)&local_5c8[0].
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish +
       local_5c8[0].
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_start[-1]._M_string_length) =
           *(undefined8 *)
            ((long)&(((BoxArray *)(local_5d8._8_8_ + 8))->m_bat).m_bat_type +
            (long)(*(_func_int ***)local_5d8._8_8_)[-3]);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_5c8,"... advect velocities\n",0x16);
    }
    else {
      local_5d8._8_8_ = amrex::OutStream();
      local_5d8._4_4_ = *(MPI_Comm *)(DAT_00756620 + -0x48);
      local_5d8._0_4_ = *(int *)(DAT_00756620 + -0x30);
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_5c8);
      *(undefined8 *)
       ((long)&local_5c8[0].
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish +
       local_5c8[0].
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_start[-1]._M_string_length) =
           *(undefined8 *)
            ((long)&(((BoxArray *)(local_5d8._8_8_ + 8))->m_bat).m_bat_type +
            (long)(*(_func_int ***)local_5d8._8_8_)[-3]);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_5c8,"... advect momenta\n",0x13);
    }
    amrex::Print::~Print((Print *)local_5d8);
  }
  pSVar1 = (this->super_AmrLevel).state.
           super_vector<amrex::StateData,_std::allocator<amrex::StateData>_>.
           super__Vector_base<amrex::StateData,_std::allocator<amrex::StateData>_>._M_impl.
           super__Vector_impl_data._M_start;
  TVar3 = amrex::StateDescriptor::timeType(pSVar1->desc);
  if (TVar3 == Point) {
    time = (pSVar1->old_time).stop;
  }
  else {
    time = ((pSVar1->old_time).start + (pSVar1->old_time).stop) * 0.5;
  }
  iVar4 = std::__cxx11::string::compare((char *)&advection_scheme_abi_cxx11_);
  dst = getDivCond(this,(uint)(iVar4 != 0),time);
  bxs = &(this->super_AmrLevel).grids;
  dm = &(this->super_AmrLevel).dmap;
  iVar4 = std::__cxx11::string::compare((char *)&advection_scheme_abi_cxx11_);
  local_5d8._0_8_ =
       (__uniq_ptr_impl<amrex::FabArrayBase,_std::default_delete<amrex::FabArrayBase>_>)0x1;
  local_5d8._8_8_ = (FabArrayBase *)0x0;
  local_5c8[0].
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_5c8[0].
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_5c8[0].
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  amrex::MultiFab::MultiFab
            ((MultiFab *)&local_3c0,bxs,dm,3,(uint)(iVar4 != 0),(MFInfo *)local_5d8,
             (this->super_AmrLevel).m_factory._M_t.
             super___uniq_ptr_impl<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>
             ._M_t.
             super__Tuple_impl<0UL,_amrex::FabFactory<amrex::FArrayBox>_*,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>
             .super__Head_base<0UL,_amrex::FabFactory<amrex::FArrayBox>_*,_false>._M_head_impl);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(local_5c8);
  amrex::FabArray<amrex::FArrayBox>::setVal<amrex::FArrayBox,_0>
            (&local_3c0,0.0,0,local_3c0.super_FabArrayBase.n_comp,
             &local_3c0.super_FabArrayBase.n_grow);
  iVar4 = nghost_state(this);
  amrex::FillPatchIterator::FillPatchIterator
            ((FillPatchIterator *)local_5d8,&this->super_AmrLevel,(MultiFab *)&local_3c0,iVar4,time,
             0,0,3);
  this_00 = &local_550;
  if (do_mom_diff != 0) {
    this_00 = (FabArray<amrex::FArrayBox> *)operator_new(0x180);
    iVar4 = nghost_state(this);
    local_918.alloc = true;
    local_918._1_7_ = 0;
    local_918.arena = (Arena *)0x0;
    local_918.tags.
    super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_918.tags.
    super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_918.tags.
    super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    amrex::MultiFab::MultiFab
              ((MultiFab *)this_00,bxs,dm,3,iVar4,&local_918,
               (this->super_AmrLevel).m_factory._M_t.
               super___uniq_ptr_impl<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>
               ._M_t.
               super__Tuple_impl<0UL,_amrex::FabFactory<amrex::FArrayBox>_*,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>
               .super__Head_base<0UL,_amrex::FabFactory<amrex::FArrayBox>_*,_false>._M_head_impl);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_918.tags.
               super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             );
  }
  if (do_mom_diff != 0) {
    iVar4 = nghost_state(this);
    amrex::FillPatchIterator::FillPatchIterator
              (&local_240,&this->super_AmrLevel,(MultiFab *)&local_3c0,iVar4,time,0,3,1);
    amrex::MFIter::MFIter((MFIter *)local_8e8,&local_550.super_FabArrayBase,true);
    if ((int)local_8d8.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage < local_8c0) {
      do {
        iVar4 = nghost_state(this);
        amrex::MFIter::growntilebox((Box *)&local_9f8,(MFIter *)local_8e8,iVar4);
        amrex::FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>
                  ((Array4<const_double> *)&local_758,
                   &local_240.m_fabs.super_FabArray<amrex::FArrayBox>,(MFIter *)local_8e8);
        amrex::FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>
                  ((Array4<const_double> *)&local_9b8,&local_550,(MFIter *)local_8e8);
        amrex::FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>
                  (&local_a80,this_00,(MFIter *)local_8e8);
        lVar14 = (long)local_9f8.p._4_4_;
        lVar12 = (long)(int)local_9f8.p;
        local_b20 = (lVar14 - local_a80.begin.y) * local_a80.jstride * 8 + lVar12 * 8 +
                    (long)local_a80.begin.x * -8 + CONCAT71(local_a80.p._1_7_,local_a80.p._0_1_);
        local_b10 = (lVar14 - local_9b8.beginIndex) * (long)local_9b8.fabArray * 8 + lVar12 * 8 +
                    (long)local_9b8.currentIndex * -8 +
                    (long)local_9b8.m_fa._M_t.
                          super___uniq_ptr_impl<amrex::FabArrayBase,_std::default_delete<amrex::FabArrayBase>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_amrex::FabArrayBase_*,_std::default_delete<amrex::FabArrayBase>_>
                          .super__Head_base<0UL,_amrex::FabArrayBase_*,_false>._M_head_impl;
        lVar11 = 0;
        do {
          iVar4 = (int)local_9f8.jstride;
          if ((int)local_9f8.jstride <= local_9f8.kstride._4_4_) {
            do {
              if (local_9f8.p._4_4_ <= (int)local_9f8.kstride) {
                lVar9 = (long)iVar4;
                lVar5 = (lVar9 - local_a80.begin.z) * local_a80.kstride * 8 + local_b20;
                lVar13 = (long)local_758.super_FabArrayBase._vptr_FabArrayBase +
                         (lVar9 - local_758.super_FabArrayBase.boxarray.m_bat.m_op.m_bndryReg.
                                  m_loshft.vect[2]) *
                         local_758.super_FabArrayBase.boxarray.m_bat.m_op._4_8_ * 8 +
                         (lVar14 - local_758.super_FabArrayBase.boxarray.m_bat.m_op.m_bndryReg.
                                   m_loshft.vect[1]) *
                         local_758.super_FabArrayBase.boxarray.m_bat._0_8_ * 8 + lVar12 * 8 +
                         (long)local_758.super_FabArrayBase.boxarray.m_bat.m_op.m_bndryReg.m_loshft.
                               vect[0] * -8;
                lVar10 = (lVar9 - local_9b8.endIndex) * local_9b8.tile_size.vect._0_8_ * 8 +
                         local_b10;
                lVar9 = lVar14;
                do {
                  if ((int)local_9f8.p <= local_9f8.jstride._4_4_) {
                    lVar16 = 0;
                    do {
                      *(double *)(lVar5 + lVar16 * 8) =
                           *(double *)(lVar10 + lVar16 * 8) * *(double *)(lVar13 + lVar16 * 8);
                      lVar16 = lVar16 + 1;
                    } while ((local_9f8.jstride._4_4_ - (int)local_9f8.p) + 1 != (int)lVar16);
                  }
                  lVar9 = lVar9 + 1;
                  lVar5 = lVar5 + local_a80.jstride * 8;
                  lVar13 = lVar13 + local_758.super_FabArrayBase.boxarray.m_bat._0_8_ * 8;
                  lVar10 = lVar10 + (long)local_9b8.fabArray * 8;
                } while ((int)local_9f8.kstride + 1 != (int)lVar9);
              }
              bVar17 = iVar4 != local_9f8.kstride._4_4_;
              iVar4 = iVar4 + 1;
            } while (bVar17);
          }
          lVar11 = lVar11 + 1;
          local_b20 = local_b20 + local_a80.nstride * 8;
          local_b10 = local_b10 + local_9b8._24_8_ * 8;
        } while (lVar11 != 3);
        amrex::MFIter::operator++((MFIter *)local_8e8);
      } while ((int)local_8d8.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage < local_8c0);
    }
    amrex::MFIter::~MFIter((MFIter *)local_8e8);
    amrex::FillPatchIterator::~FillPatchIterator(&local_240);
  }
  iVar4 = std::__cxx11::string::compare((char *)&advection_scheme_abi_cxx11_);
  if (iVar4 != 0) {
    local_a20._M_t.super__Tuple_impl<0UL,_amrex::MultiFab_*,_std::default_delete<amrex::MultiFab>_>.
    super__Head_base<0UL,_amrex::MultiFab_*,_false>._M_head_impl =
         (this->super_AmrLevel).state.
         super_vector<amrex::StateData,_std::allocator<amrex::StateData>_>.
         super__Vector_base<amrex::StateData,_std::allocator<amrex::StateData>_>._M_impl.
         super__Vector_impl_data._M_start[2].old_data._M_t.
         super___uniq_ptr_impl<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>._M_t;
    iVar4 = std::__cxx11::string::compare((char *)&advection_scheme_abi_cxx11_);
    amrex::FillPatchIterator::FillPatchIterator
              (&local_240,&this->super_AmrLevel,(MultiFab *)&local_3c0,(uint)(iVar4 != 0),time,0,3,
               NUM_SCALARS);
    iVar4 = std::__cxx11::string::compare((char *)&advection_scheme_abi_cxx11_);
    src = getDsdt(this,(uint)(iVar4 != 0),time);
    iVar4 = std::__cxx11::string::compare((char *)&advection_scheme_abi_cxx11_);
    amrex::MultiFab::Saxpy(dst,dt * 0.5,src,0,0,1,(uint)(iVar4 != 0));
    (*(src->super_FabArray<amrex::FArrayBox>).super_FabArrayBase._vptr_FabArrayBase[1])(src);
    iVar4 = std::__cxx11::string::compare((char *)&advection_scheme_abi_cxx11_);
    local_8e8._0_8_ =
         (__uniq_ptr_impl<amrex::FabArrayBase,_std::default_delete<amrex::FabArrayBase>_>)0x1;
    local_8e8._8_8_ = (FabArrayBase *)0x0;
    local_8d8.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_8d8.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_8d8.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    amrex::MultiFab::MultiFab
              ((MultiFab *)&local_758,bxs,dm,3,(uint)(iVar4 != 0),(MFInfo *)local_8e8,
               (this->super_AmrLevel).m_factory._M_t.
               super___uniq_ptr_impl<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>
               ._M_t.
               super__Tuple_impl<0UL,_amrex::FabFactory<amrex::FArrayBox>_*,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>
               .super__Head_base<0UL,_amrex::FabFactory<amrex::FArrayBox>_*,_false>._M_head_impl);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_8d8);
    if ((be_cn_theta != 1.0) || (NAN(be_cn_theta))) {
      (*(this->super_AmrLevel)._vptr_AmrLevel[0x33])(time,this,&local_758,0,3);
    }
    else {
      amrex::FabArray<amrex::FArrayBox>::setVal<amrex::FArrayBox,_0>
                (&local_758,0.0,0,local_758.super_FabArrayBase.n_comp,
                 &local_758.super_FabArrayBase.n_grow);
    }
    amrex::MFIter::MFIter(&local_9b8,&local_550.super_FabArrayBase,true);
    if (local_9b8.currentIndex < local_9b8.endIndex) {
      do {
        piVar8 = &local_9b8.currentIndex;
        iVar4 = std::__cxx11::string::compare((char *)&advection_scheme_abi_cxx11_);
        amrex::MFIter::growntilebox(&local_a3c,&local_9b8,(uint)(iVar4 != 0));
        if (getForceVerbose != 0) {
          local_8e8._8_8_ = amrex::OutStream();
          local_8e8._4_4_ = *(undefined4 *)(DAT_00756620 + -0x48);
          local_8e8._0_4_ = *(undefined4 *)(DAT_00756620 + -0x30);
          std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_8d8);
          *(undefined8 *)
           ((long)&local_8d8.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish +
           local_8d8.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start[-1]._M_string_length) =
               *(undefined8 *)
                ((long)&(((BoxArray *)(local_8e8._8_8_ + 8))->m_bat).m_bat_type +
                (long)(*(_func_int ***)local_8e8._8_8_)[-3]);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_8d8,"---",3);
          local_a80.p._0_1_ = 10;
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&local_8d8,(char *)&local_a80,1);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&local_8d8,"B - velocity advection:",0x17);
          local_a80.p._0_1_ = 10;
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&local_8d8,(char *)&local_a80,1);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&local_8d8,"Calling getForce...",0x13);
          local_a80.p._0_1_ = 10;
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&local_8d8,(char *)&local_a80,1);
          amrex::Print::~Print((Print *)local_8e8);
        }
        piVar6 = piVar8;
        if (local_9b8.local_index_map != (Vector<int,_std::allocator<int>_> *)0x0) {
          piVar6 = ((local_9b8.local_index_map)->super_vector<int,_std::allocator<int>_>).
                   super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                   _M_start + local_9b8.currentIndex;
        }
        piVar7 = piVar8;
        if (local_9b8.local_index_map != (Vector<int,_std::allocator<int>_> *)0x0) {
          piVar7 = ((local_9b8.local_index_map)->super_vector<int,_std::allocator<int>_>).
                   super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                   _M_start + local_9b8.currentIndex;
        }
        if (local_9b8.local_index_map != (Vector<int,_std::allocator<int>_> *)0x0) {
          piVar8 = ((local_9b8.local_index_map)->super_vector<int,_std::allocator<int>_>).
                   super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                   _M_start + local_9b8.currentIndex;
        }
        (*(this->super_AmrLevel)._vptr_AmrLevel[0x2a])
                  (time,this,
                   local_3c0.m_fabs_v.
                   super__Vector_base<amrex::FArrayBox_*,_std::allocator<amrex::FArrayBox_*>_>.
                   _M_impl.super__Vector_impl_data._M_start[*piVar6],&local_a3c,0,3,
                   local_550.m_fabs_v.
                   super__Vector_base<amrex::FArrayBox_*,_std::allocator<amrex::FArrayBox_*>_>.
                   _M_impl.super__Vector_impl_data._M_start[*piVar7],
                   local_240.m_fabs.super_FabArray<amrex::FArrayBox>.m_fabs_v.
                   super__Vector_base<amrex::FArrayBox_*,_std::allocator<amrex::FArrayBox_*>_>.
                   _M_impl.super__Vector_impl_data._M_start[*piVar8],0,&local_9b8);
        amrex::FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>
                  ((Array4<double> *)local_8e8,&local_3c0,&local_9b8,0);
        amrex::FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>
                  ((Array4<const_double> *)&local_a80,&local_758,&local_9b8,0);
        amrex::FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>
                  (&local_9f8,
                   (FabArray<amrex::FArrayBox> *)
                   local_a20._M_t.
                   super__Tuple_impl<0UL,_amrex::MultiFab_*,_std::default_delete<amrex::MultiFab>_>.
                   super__Head_base<0UL,_amrex::MultiFab_*,_false>._M_head_impl,&local_9b8);
        amrex::FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>
                  (&local_958,&local_240.m_fabs.super_FabArray<amrex::FArrayBox>,&local_9b8);
        iVar4 = do_mom_diff;
        lVar9 = (long)local_a3c.smallend.vect[1];
        lVar14 = (long)local_a3c.smallend.vect[0];
        lVar12 = CONCAT44(local_9f8.jstride._4_4_,(int)local_9f8.jstride) * 8;
        local_b18 = (lVar9 - local_9f8.begin.y) * lVar12 + lVar14 * 8 + (long)local_9f8.begin.x * -8
                    + CONCAT44(local_9f8.p._4_4_,(int)local_9f8.p);
        local_a08 = local_9f8.nstride * 8;
        local_af0 = (lVar9 - local_a80.begin.y) * local_a80.jstride * 8 + lVar14 * 8 +
                    (long)local_a80.begin.x * -8 + CONCAT71(local_a80.p._1_7_,local_a80.p._0_1_);
        local_a10 = local_a80.nstride * 8;
        local_af8 = (lVar9 - local_8d8.
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_) *
                    local_8e8._8_8_ * 8 + lVar14 * 8 +
                    (long)(int)local_8d8.
                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_end_of_storage * -8 +
                    local_8e8._0_8_;
        local_a18 = (long)local_8d8.
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_finish * 8;
        lVar11 = 0;
        do {
          local_a00 = lVar11;
          iVar2 = local_a3c.smallend.vect[2];
          if (local_a3c.smallend.vect[2] <= local_a3c.bigend.vect[2]) {
            do {
              if (local_a3c.smallend.vect[1] <= local_a3c.bigend.vect[1]) {
                lVar11 = (long)iVar2;
                lVar5 = (long)local_958.p +
                        (lVar11 - local_958.begin.z) * local_958.kstride * 8 +
                        (lVar9 - local_958.begin.y) * local_958.jstride * 8 + lVar14 * 8 +
                        (long)local_958.begin.x * -8;
                lVar10 = (lVar11 - local_9f8.begin.z) *
                         CONCAT44(local_9f8.kstride._4_4_,(int)local_9f8.kstride) * 8 + local_b18;
                lVar13 = (lVar11 - local_a80.begin.z) * local_a80.kstride * 8 + local_af0;
                lVar16 = (lVar11 - local_8c0) *
                         (long)local_8d8.
                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_start * 8 + local_af8;
                lVar11 = lVar9;
                do {
                  if (local_a3c.smallend.vect[0] <= local_a3c.bigend.vect[0]) {
                    lVar15 = 0;
                    do {
                      dVar18 = (*(double *)(lVar16 + lVar15 * 8) + *(double *)(lVar13 + lVar15 * 8))
                               - *(double *)(lVar10 + lVar15 * 8);
                      *(double *)(lVar16 + lVar15 * 8) = dVar18;
                      if (iVar4 == 0) {
                        *(double *)(lVar16 + lVar15 * 8) = dVar18 / *(double *)(lVar5 + lVar15 * 8);
                      }
                      lVar15 = lVar15 + 1;
                    } while ((local_a3c.bigend.vect[0] - local_a3c.smallend.vect[0]) + 1 !=
                             (int)lVar15);
                  }
                  lVar11 = lVar11 + 1;
                  lVar5 = lVar5 + local_958.jstride * 8;
                  lVar10 = lVar10 + lVar12;
                  lVar13 = lVar13 + local_a80.jstride * 8;
                  lVar16 = lVar16 + local_8e8._8_8_ * 8;
                } while (local_a3c.bigend.vect[1] + 1 != (int)lVar11);
              }
              bVar17 = iVar2 != local_a3c.bigend.vect[2];
              iVar2 = iVar2 + 1;
            } while (bVar17);
          }
          local_b18 = local_b18 + local_a08;
          local_af0 = local_af0 + local_a10;
          local_af8 = local_af8 + local_a18;
          lVar11 = local_a00 + 1;
        } while (local_a00 + 1 != 3);
        amrex::MFIter::operator++(&local_9b8);
      } while (local_9b8.currentIndex < local_9b8.endIndex);
    }
    amrex::MFIter::~MFIter(&local_9b8);
    amrex::MultiFab::~MultiFab((MultiFab *)&local_758);
    amrex::FillPatchIterator::~FillPatchIterator(&local_240);
  }
  ComputeAofs(this,0,3,(MultiFab *)this_00,0,(MultiFab *)&local_3c0,dst,true,dt);
  (*(dst->super_FabArray<amrex::FArrayBox>).super_FabArrayBase._vptr_FabArrayBase[1])();
  if (do_mom_diff != 0) {
    (*(this_00->super_FabArrayBase)._vptr_FabArrayBase[1])(this_00);
  }
  amrex::FillPatchIterator::~FillPatchIterator((FillPatchIterator *)local_5d8);
  amrex::MultiFab::~MultiFab((MultiFab *)&local_3c0);
  return;
}

Assistant:

void
NavierStokesBase::velocity_advection (Real dt)
{
    BL_PROFILE("NavierStokesBase::velocity_advection()");

    if (verbose)
    {
        if (do_mom_diff == 0)
        {

            amrex::Print() << "... advect velocities\n";
        }
        else
        {
            amrex::Print() << "... advect momenta\n";
        }
    }

    const Real  prev_time      = state[State_Type].prevTime();

    MultiFab* divu_fp = getDivCond(nghost_force(),prev_time);

    MultiFab forcing_term( grids, dmap, AMREX_SPACEDIM, nghost_force(), MFInfo(),Factory());
    forcing_term.setVal(0.0);

    FillPatchIterator U_fpi(*this,forcing_term, nghost_state(),prev_time,State_Type,Xvel,AMREX_SPACEDIM);
    MultiFab& Umf=U_fpi.get_mf();

    //
    // S_term is the state we are solving for: either velocity or momentum
    //
    MultiFab* S_term;

    S_term = (do_mom_diff)
        ? new MultiFab( grids, dmap, AMREX_SPACEDIM, nghost_state(), MFInfo(), Factory())
        : &Umf;

    if (do_mom_diff)
    {
        FillPatchIterator Rho_fpi(*this,forcing_term,nghost_state(),prev_time,State_Type,Density,1);
        MultiFab& Rmf=Rho_fpi.get_mf();

        for (MFIter U_mfi(Umf,TilingIfNotGPU()); U_mfi.isValid(); ++U_mfi)
        {
            auto const state_bx = U_mfi.growntilebox(nghost_state());

            auto const& dens = Rmf.const_array(U_mfi); //Previous time, nghost_state() grow cells filled
            auto const& vel  = Umf.const_array(U_mfi);
            auto const& st   = S_term->array(U_mfi);

            amrex::ParallelFor(state_bx, AMREX_SPACEDIM, [ dens, vel, st ]
            AMREX_GPU_DEVICE (int i, int j, int k, int n) noexcept
            { st(i,j,k,n) = vel(i,j,k,n) * dens(i,j,k); });
        }
    }

    //
    // Forcing term not used in MOL
    //
    if ( advection_scheme != "MOL" )
    {
        MultiFab& Gp = get_old_data(Gradp_Type);

        FillPatchIterator S_fpi(*this,forcing_term,nghost_force(),prev_time,State_Type,Density,NUM_SCALARS);
        MultiFab& Smf=S_fpi.get_mf();

	// Get divu to time n+1/2
        MultiFab* dsdt    = getDsdt(nghost_force(),prev_time);
        MultiFab::Saxpy(*divu_fp, 0.5*dt, *dsdt, 0, 0, 1, nghost_force());
        delete dsdt;

        MultiFab visc_terms(grids,dmap,AMREX_SPACEDIM,nghost_force(),MFInfo(),Factory());
        if (be_cn_theta != 1.0)
            getViscTerms(visc_terms,Xvel,AMREX_SPACEDIM,prev_time);
        else
            visc_terms.setVal(0.0);


#ifdef _OPENMP
#pragma omp parallel if (Gpu::notInLaunchRegion())
#endif
        for (MFIter U_mfi(Umf,TilingIfNotGPU()); U_mfi.isValid(); ++U_mfi)
        {

            auto const force_bx = U_mfi.growntilebox(nghost_force()); // Box for forcing term

            if (getForceVerbose)
            {
                amrex::Print() << "---" << '\n'
                               << "B - velocity advection:" << '\n'
                               << "Calling getForce..." << '\n';
            }
            getForce(forcing_term[U_mfi],force_bx,Xvel,AMREX_SPACEDIM,
                     prev_time,Umf[U_mfi],Smf[U_mfi],0,U_mfi);

            //
            // Compute the total forcing.
            //
            auto const& tf   = forcing_term.array(U_mfi,Xvel);
            auto const& visc = visc_terms.const_array(U_mfi,Xvel);
            auto const& gp   = Gp.const_array(U_mfi);
            auto const& rho  = Smf.const_array(U_mfi); //Previous time, nghost_force() grow cells filled

            bool is_convective = do_mom_diff ? false : true;
            amrex::ParallelFor(force_bx, AMREX_SPACEDIM, [ tf, visc, gp, rho, is_convective]
            AMREX_GPU_DEVICE (int i, int j, int k, int n) noexcept
            {
                tf(i,j,k,n) = ( tf(i,j,k,n) + visc(i,j,k,n) - gp(i,j,k,n) );
                if (is_convective)
                    tf(i,j,k,n) /= rho(i,j,k);
            });
        }
    }

    ComputeAofs( Xvel, AMREX_SPACEDIM, *S_term, 0, forcing_term, *divu_fp, true, dt );

    delete divu_fp;
    if (do_mom_diff)
        delete S_term;
}